

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::AggressiveDCEPass::GetHeaderBranch(AggressiveDCEPass *this,BasicBlock *blk)

{
  BasicBlock *this_00;
  BasicBlock *header_block;
  BasicBlock *blk_local;
  AggressiveDCEPass *this_local;
  
  if (blk == (BasicBlock *)0x0) {
    this_local = (AggressiveDCEPass *)0x0;
  }
  else {
    this_00 = GetHeaderBlock(this,blk);
    if (this_00 == (BasicBlock *)0x0) {
      this_local = (AggressiveDCEPass *)0x0;
    }
    else {
      this_local = (AggressiveDCEPass *)BasicBlock::terminator(this_00);
    }
  }
  return (Instruction *)this_local;
}

Assistant:

Instruction* AggressiveDCEPass::GetHeaderBranch(BasicBlock* blk) {
  if (blk == nullptr) {
    return nullptr;
  }
  BasicBlock* header_block = GetHeaderBlock(blk);
  if (header_block == nullptr) {
    return nullptr;
  }
  return header_block->terminator();
}